

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  NodeRef *pNVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  NodeRef *local_1578;
  undefined1 local_1508 [16];
  undefined1 (*local_14f0) [16];
  NodeRef *local_14e8;
  Scene *scene;
  ulong local_14d8;
  long local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13d8 [16];
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined4 local_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11f8._4_4_ = fVar2;
  local_11f8._0_4_ = fVar2;
  local_11f8._8_4_ = fVar2;
  local_11f8._12_4_ = fVar2;
  local_11f8._16_4_ = fVar2;
  local_11f8._20_4_ = fVar2;
  local_11f8._24_4_ = fVar2;
  local_11f8._28_4_ = fVar2;
  auVar49 = ZEXT3264(local_11f8);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = fVar59;
  local_1218._0_4_ = fVar59;
  local_1218._8_4_ = fVar59;
  local_1218._12_4_ = fVar59;
  local_1218._16_4_ = fVar59;
  local_1218._20_4_ = fVar59;
  local_1218._24_4_ = fVar59;
  local_1218._28_4_ = fVar59;
  auVar53 = ZEXT3264(local_1218);
  fVar64 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = fVar64;
  local_1238._0_4_ = fVar64;
  local_1238._8_4_ = fVar64;
  local_1238._12_4_ = fVar64;
  local_1238._16_4_ = fVar64;
  local_1238._20_4_ = fVar64;
  local_1238._24_4_ = fVar64;
  local_1238._28_4_ = fVar64;
  auVar54 = ZEXT3264(local_1238);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar64 = fVar64 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar21 = uVar22 ^ 0x20;
  local_1258._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1258._8_4_ = -fVar2;
  local_1258._12_4_ = -fVar2;
  local_1258._16_4_ = -fVar2;
  local_1258._20_4_ = -fVar2;
  local_1258._24_4_ = -fVar2;
  local_1258._28_4_ = -fVar2;
  auVar58 = ZEXT3264(local_1258);
  local_1278._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  local_1278._8_4_ = -fVar59;
  local_1278._12_4_ = -fVar59;
  local_1278._16_4_ = -fVar59;
  local_1278._20_4_ = -fVar59;
  local_1278._24_4_ = -fVar59;
  local_1278._28_4_ = -fVar59;
  auVar63 = ZEXT3264(local_1278);
  iVar3 = (tray->tnear).field_0.i[k];
  local_1298._4_4_ = iVar3;
  local_1298._0_4_ = iVar3;
  local_1298._8_4_ = iVar3;
  local_1298._12_4_ = iVar3;
  local_1298._16_4_ = iVar3;
  local_1298._20_4_ = iVar3;
  local_1298._24_4_ = iVar3;
  local_1298._28_4_ = iVar3;
  auVar68 = ZEXT3264(local_1298);
  iVar3 = (tray->tfar).field_0.i[k];
  local_12b8._4_4_ = iVar3;
  local_12b8._0_4_ = iVar3;
  local_12b8._8_4_ = iVar3;
  local_12b8._12_4_ = iVar3;
  local_12b8._16_4_ = iVar3;
  local_12b8._20_4_ = iVar3;
  local_12b8._24_4_ = iVar3;
  local_12b8._28_4_ = iVar3;
  auVar74 = ZEXT3264(local_12b8);
  local_12d8._0_8_ = CONCAT44(fVar64,fVar64) ^ 0x8000000080000000;
  local_12d8._8_4_ = -fVar64;
  local_12d8._12_4_ = -fVar64;
  local_12d8._16_4_ = -fVar64;
  local_12d8._20_4_ = -fVar64;
  local_12d8._24_4_ = -fVar64;
  local_12d8._28_4_ = -fVar64;
  auVar76 = ZEXT3264(local_12d8);
  local_14f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar13 = stack + 1;
  local_14d8 = uVar22;
LAB_01663b6b:
  do {
    local_14e8 = pNVar13;
    if (local_14e8 == stack) {
LAB_01664588:
      return local_14e8 != stack;
    }
    local_1578 = local_14e8 + -1;
    sVar30 = local_14e8[-1].ptr;
    while ((sVar30 & 8) == 0) {
      uVar14 = sVar30 & 0xfffffffffffffff0;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar37._4_4_ = uVar4;
      auVar37._0_4_ = uVar4;
      auVar37._8_4_ = uVar4;
      auVar37._12_4_ = uVar4;
      auVar37._16_4_ = uVar4;
      auVar37._20_4_ = uVar4;
      auVar37._24_4_ = uVar4;
      auVar37._28_4_ = uVar4;
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar22),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + uVar22));
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar49._0_32_,auVar58._0_32_);
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar20),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + uVar20));
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar53._0_32_,auVar63._0_32_);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar32));
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar31),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + uVar31));
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar54._0_32_,auVar76._0_32_);
      auVar11 = vpmaxsd_avx2(ZEXT1632(auVar67),auVar68._0_32_);
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar21),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + uVar21));
      auVar10 = vpmaxsd_avx2(auVar10,auVar11);
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + (uVar20 ^ 0x20)),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + (uVar20 ^ 0x20)));
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar49._0_32_,auVar58._0_32_);
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar53._0_32_,auVar63._0_32_);
      auVar11 = vpminsd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar32));
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + (uVar31 ^ 0x20)),auVar37,
                                *(undefined1 (*) [32])(uVar14 + 0x40 + (uVar31 ^ 0x20)));
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar54._0_32_,auVar76._0_32_);
      auVar12 = vpminsd_avx2(ZEXT1632(auVar67),auVar74._0_32_);
      auVar11 = vpminsd_avx2(auVar11,auVar12);
      auVar10 = vcmpps_avx(auVar10,auVar11,2);
      if (((uint)sVar30 & 7) == 6) {
        auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar14 + 0x1c0),auVar37,2);
        auVar12 = vcmpps_avx(auVar37,*(undefined1 (*) [32])(uVar14 + 0x1e0),1);
        auVar11 = vandps_avx(auVar11,auVar12);
        auVar10 = vandps_avx(auVar11,auVar10);
        auVar67 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
      }
      else {
        auVar67 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
      }
      auVar32 = vpsllw_avx(auVar67,0xf);
      auVar67 = vpacksswb_avx(auVar32,auVar32);
      bVar9 = SUB161(auVar67 >> 7,0) & 1 | (SUB161(auVar67 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar67 >> 0x17,0) & 1) << 2 | (SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar67 >> 0x27,0) & 1) << 4 | (SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar67 >> 0x37,0) & 1) << 6 | SUB161(auVar67 >> 0x3f,0) << 7;
      pNVar13 = local_1578;
      if ((((((((auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
      goto LAB_01663b6b;
      lVar18 = 0;
      for (uVar16 = (ulong)bVar9; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      sVar30 = *(size_t *)(uVar14 + lVar18 * 8);
      uVar15 = bVar9 - 1 & (uint)bVar9;
      uVar16 = (ulong)uVar15;
      if (uVar15 != 0) {
        do {
          local_1578->ptr = sVar30;
          local_1578 = local_1578 + 1;
          lVar18 = 0;
          for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar16 = uVar16 - 1 & uVar16;
          sVar30 = *(size_t *)(uVar14 + lVar18 * 8);
        } while (uVar16 != 0);
      }
    }
    local_14d0 = (ulong)((uint)sVar30 & 0xf) - 8;
    uVar14 = sVar30 & 0xfffffffffffffff0;
    for (lVar18 = 0; pNVar13 = local_1578, lVar18 != local_14d0; lVar18 = lVar18 + 1) {
      lVar28 = lVar18 * 0x50;
      scene = context->scene;
      pGVar6 = (scene->geometries).items[*(uint *)(uVar14 + 0x30 + lVar28)].ptr;
      fVar2 = (pGVar6->time_range).lower;
      fVar2 = pGVar6->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar2) / ((pGVar6->time_range).upper - fVar2));
      auVar67 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
      auVar67 = vminss_avx(auVar67,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
      auVar42 = vmaxss_avx(ZEXT816(0),auVar67);
      lVar17 = (long)(int)auVar42._0_4_ * 0x38;
      uVar29 = (ulong)*(uint *)(uVar14 + 4 + lVar28);
      lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar17);
      lVar17 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar17);
      auVar67 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar14 + lVar28) * 4);
      uVar16 = (ulong)*(uint *)(uVar14 + 0x10 + lVar28);
      auVar32 = *(undefined1 (*) [16])(lVar7 + uVar16 * 4);
      uVar23 = (ulong)*(uint *)(uVar14 + 0x20 + lVar28);
      auVar47 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
      uVar24 = (ulong)*(uint *)(uVar14 + 0x14 + lVar28);
      auVar62 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
      uVar25 = (ulong)*(uint *)(uVar14 + 0x24 + lVar28);
      auVar57 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      uVar19 = (ulong)*(uint *)(uVar14 + 8 + lVar28);
      auVar38 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
      local_14c0 = (ulong)*(uint *)(uVar14 + 0x18 + lVar28);
      auVar56 = *(undefined1 (*) [16])(lVar7 + local_14c0 * 4);
      uVar26 = (ulong)*(uint *)(uVar14 + 0x28 + lVar28);
      auVar39 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
      uVar27 = (ulong)*(uint *)(uVar14 + 0xc + lVar28);
      auVar43 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
      local_14c8 = (ulong)*(uint *)(uVar14 + 0x1c + lVar28);
      auVar34 = *(undefined1 (*) [16])(lVar7 + local_14c8 * 4);
      uVar22 = (ulong)*(uint *)(uVar14 + 0x2c + lVar28);
      auVar35 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
      auVar36 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar14 + lVar28) * 4);
      auVar50 = *(undefined1 (*) [16])(lVar17 + uVar16 * 4);
      fVar2 = fVar2 - auVar42._0_4_;
      auVar42 = vunpcklps_avx(auVar67,auVar38);
      auVar38 = vunpckhps_avx(auVar67,auVar38);
      auVar55 = vunpcklps_avx(auVar33,auVar43);
      auVar33 = vunpckhps_avx(auVar33,auVar43);
      auVar67 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
      auVar45 = vunpcklps_avx(auVar38,auVar33);
      auVar46 = vunpcklps_avx(auVar42,auVar55);
      auVar38 = vunpckhps_avx(auVar42,auVar55);
      auVar43 = vunpcklps_avx(auVar32,auVar56);
      auVar33 = vunpckhps_avx(auVar32,auVar56);
      auVar56 = vunpcklps_avx(auVar62,auVar34);
      auVar62 = vunpckhps_avx(auVar62,auVar34);
      auVar32 = *(undefined1 (*) [16])(lVar17 + uVar19 * 4);
      auVar34 = vunpcklps_avx(auVar33,auVar62);
      auVar42 = vunpcklps_avx(auVar43,auVar56);
      auVar62 = vunpckhps_avx(auVar43,auVar56);
      auVar43 = vunpcklps_avx(auVar47,auVar39);
      auVar56 = vunpckhps_avx(auVar47,auVar39);
      auVar55 = vunpcklps_avx(auVar57,auVar35);
      auVar39 = vunpckhps_avx(auVar57,auVar35);
      auVar33 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
      auVar35 = vunpcklps_avx(auVar56,auVar39);
      auVar47 = vunpcklps_avx(auVar43,auVar55);
      auVar56 = vunpckhps_avx(auVar43,auVar55);
      auVar39 = vunpcklps_avx(auVar36,auVar32);
      auVar32 = vunpckhps_avx(auVar36,auVar32);
      auVar43 = vunpcklps_avx(auVar67,auVar33);
      auVar33 = vunpckhps_avx(auVar67,auVar33);
      auVar67 = *(undefined1 (*) [16])(lVar17 + local_14c0 * 4);
      auVar36 = vunpcklps_avx(auVar32,auVar33);
      auVar55 = vunpcklps_avx(auVar39,auVar43);
      auVar33 = vunpckhps_avx(auVar39,auVar43);
      auVar43 = vunpcklps_avx(auVar50,auVar67);
      auVar39 = vunpckhps_avx(auVar50,auVar67);
      auVar67 = *(undefined1 (*) [16])(lVar17 + uVar24 * 4);
      auVar32 = *(undefined1 (*) [16])(lVar17 + local_14c8 * 4);
      auVar50 = vunpcklps_avx(auVar67,auVar32);
      auVar67 = vunpckhps_avx(auVar67,auVar32);
      auVar57 = vunpcklps_avx(auVar39,auVar67);
      auVar61 = vunpcklps_avx(auVar43,auVar50);
      auVar39 = vunpckhps_avx(auVar43,auVar50);
      auVar67 = *(undefined1 (*) [16])(lVar17 + uVar23 * 4);
      auVar32 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
      auVar50 = vunpcklps_avx(auVar67,auVar32);
      auVar43 = vunpckhps_avx(auVar67,auVar32);
      auVar67 = *(undefined1 (*) [16])(lVar17 + uVar25 * 4);
      auVar32 = *(undefined1 (*) [16])(lVar17 + uVar22 * 4);
      auVar60 = vunpcklps_avx(auVar67,auVar32);
      auVar67 = vunpckhps_avx(auVar67,auVar32);
      auVar32 = vunpcklps_avx(auVar43,auVar67);
      auVar43 = vunpcklps_avx(auVar50,auVar60);
      auVar67 = vunpckhps_avx(auVar50,auVar60);
      fVar59 = 1.0 - fVar2;
      auVar77._4_4_ = fVar59;
      auVar77._0_4_ = fVar59;
      auVar77._8_4_ = fVar59;
      auVar77._12_4_ = fVar59;
      auVar50._0_4_ = fVar2 * auVar55._0_4_;
      auVar50._4_4_ = fVar2 * auVar55._4_4_;
      auVar50._8_4_ = fVar2 * auVar55._8_4_;
      auVar50._12_4_ = fVar2 * auVar55._12_4_;
      auVar50 = vfmadd231ps_fma(auVar50,auVar77,auVar46);
      auVar55._0_4_ = fVar2 * auVar33._0_4_;
      auVar55._4_4_ = fVar2 * auVar33._4_4_;
      auVar55._8_4_ = fVar2 * auVar33._8_4_;
      auVar55._12_4_ = fVar2 * auVar33._12_4_;
      auVar55 = vfmadd231ps_fma(auVar55,auVar77,auVar38);
      auVar60._0_4_ = fVar2 * auVar36._0_4_;
      auVar60._4_4_ = fVar2 * auVar36._4_4_;
      auVar60._8_4_ = fVar2 * auVar36._8_4_;
      auVar60._12_4_ = fVar2 * auVar36._12_4_;
      auVar36 = vfmadd231ps_fma(auVar60,auVar77,auVar45);
      auVar33._0_4_ = fVar2 * auVar61._0_4_;
      auVar33._4_4_ = fVar2 * auVar61._4_4_;
      auVar33._8_4_ = fVar2 * auVar61._8_4_;
      auVar33._12_4_ = fVar2 * auVar61._12_4_;
      auVar33 = vfmadd231ps_fma(auVar33,auVar77,auVar42);
      auVar38._0_4_ = fVar2 * auVar39._0_4_;
      auVar38._4_4_ = fVar2 * auVar39._4_4_;
      auVar38._8_4_ = fVar2 * auVar39._8_4_;
      auVar38._12_4_ = fVar2 * auVar39._12_4_;
      auVar62 = vfmadd231ps_fma(auVar38,auVar77,auVar62);
      auVar42._0_4_ = fVar2 * auVar57._0_4_;
      auVar42._4_4_ = fVar2 * auVar57._4_4_;
      auVar42._8_4_ = fVar2 * auVar57._8_4_;
      auVar42._12_4_ = fVar2 * auVar57._12_4_;
      auVar38 = vfmadd231ps_fma(auVar42,auVar77,auVar34);
      puVar1 = (undefined8 *)(uVar14 + 0x30 + lVar28);
      local_1438 = *puVar1;
      uStack_1430 = puVar1[1];
      puVar1 = (undefined8 *)(uVar14 + 0x40 + lVar28);
      auVar46._0_4_ = fVar2 * auVar43._0_4_;
      auVar46._4_4_ = fVar2 * auVar43._4_4_;
      auVar46._8_4_ = fVar2 * auVar43._8_4_;
      auVar46._12_4_ = fVar2 * auVar43._12_4_;
      auVar72._0_4_ = fVar2 * auVar67._0_4_;
      auVar72._4_4_ = fVar2 * auVar67._4_4_;
      auVar72._8_4_ = fVar2 * auVar67._8_4_;
      auVar72._12_4_ = fVar2 * auVar67._12_4_;
      auVar79._0_4_ = fVar2 * auVar32._0_4_;
      auVar79._4_4_ = fVar2 * auVar32._4_4_;
      auVar79._8_4_ = fVar2 * auVar32._8_4_;
      auVar79._12_4_ = fVar2 * auVar32._12_4_;
      auVar39 = vfmadd231ps_fma(auVar46,auVar77,auVar47);
      auVar56 = vfmadd231ps_fma(auVar72,auVar77,auVar56);
      auVar43 = vfmadd231ps_fma(auVar79,auVar77,auVar35);
      local_1448 = *puVar1;
      uStack_1440 = puVar1[1];
      auVar32 = vsubps_avx(auVar50,auVar33);
      auVar67 = vsubps_avx(auVar55,auVar62);
      auVar33 = vsubps_avx(auVar36,auVar38);
      auVar62 = vsubps_avx(auVar39,auVar50);
      auVar38 = vsubps_avx(auVar56,auVar55);
      auVar56 = vsubps_avx(auVar43,auVar36);
      auVar39._0_4_ = auVar67._0_4_ * auVar56._0_4_;
      auVar39._4_4_ = auVar67._4_4_ * auVar56._4_4_;
      auVar39._8_4_ = auVar67._8_4_ * auVar56._8_4_;
      auVar39._12_4_ = auVar67._12_4_ * auVar56._12_4_;
      local_1398 = vfmsub231ps_fma(auVar39,auVar38,auVar33);
      auVar45._0_4_ = auVar33._0_4_ * auVar62._0_4_;
      auVar45._4_4_ = auVar33._4_4_ * auVar62._4_4_;
      auVar45._8_4_ = auVar33._8_4_ * auVar62._8_4_;
      auVar45._12_4_ = auVar33._12_4_ * auVar62._12_4_;
      local_1388 = vfmsub231ps_fma(auVar45,auVar56,auVar32);
      uVar4 = *(undefined4 *)(ray + k * 4);
      auVar43._4_4_ = uVar4;
      auVar43._0_4_ = uVar4;
      auVar43._8_4_ = uVar4;
      auVar43._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar47._4_4_ = uVar4;
      auVar47._0_4_ = uVar4;
      auVar47._8_4_ = uVar4;
      auVar47._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar34._4_4_ = uVar4;
      auVar34._0_4_ = uVar4;
      auVar34._8_4_ = uVar4;
      auVar34._12_4_ = uVar4;
      fVar2 = *(float *)(ray + k * 4 + 0x40);
      auVar78._4_4_ = fVar2;
      auVar78._0_4_ = fVar2;
      auVar78._8_4_ = fVar2;
      auVar78._12_4_ = fVar2;
      auVar39 = vsubps_avx(auVar50,auVar43);
      fVar59 = *(float *)(ray + k * 4 + 0x50);
      auVar80._4_4_ = fVar59;
      auVar80._0_4_ = fVar59;
      auVar80._8_4_ = fVar59;
      auVar80._12_4_ = fVar59;
      auVar43 = vsubps_avx(auVar55,auVar47);
      fVar64 = *(float *)(ray + k * 4 + 0x60);
      auVar81._4_4_ = fVar64;
      auVar81._0_4_ = fVar64;
      auVar81._8_4_ = fVar64;
      auVar81._12_4_ = fVar64;
      auVar34 = vsubps_avx(auVar36,auVar34);
      auVar35._0_4_ = fVar2 * auVar43._0_4_;
      auVar35._4_4_ = fVar2 * auVar43._4_4_;
      auVar35._8_4_ = fVar2 * auVar43._8_4_;
      auVar35._12_4_ = fVar2 * auVar43._12_4_;
      auVar35 = vfmsub231ps_fma(auVar35,auVar39,auVar80);
      auVar61._0_4_ = auVar56._0_4_ * auVar35._0_4_;
      auVar61._4_4_ = auVar56._4_4_ * auVar35._4_4_;
      auVar61._8_4_ = auVar56._8_4_ * auVar35._8_4_;
      auVar61._12_4_ = auVar56._12_4_ * auVar35._12_4_;
      auVar36._0_4_ = auVar33._0_4_ * auVar35._0_4_;
      auVar36._4_4_ = auVar33._4_4_ * auVar35._4_4_;
      auVar36._8_4_ = auVar33._8_4_ * auVar35._8_4_;
      auVar36._12_4_ = auVar33._12_4_ * auVar35._12_4_;
      auVar56._0_4_ = fVar64 * auVar39._0_4_;
      auVar56._4_4_ = fVar64 * auVar39._4_4_;
      auVar56._8_4_ = fVar64 * auVar39._8_4_;
      auVar56._12_4_ = fVar64 * auVar39._12_4_;
      auVar56 = vfmsub231ps_fma(auVar56,auVar34,auVar78);
      auVar33 = vfmadd231ps_fma(auVar61,auVar56,auVar38);
      auVar56 = vfmadd231ps_fma(auVar36,auVar67,auVar56);
      auVar57._0_4_ = auVar38._0_4_ * auVar32._0_4_;
      auVar57._4_4_ = auVar38._4_4_ * auVar32._4_4_;
      auVar57._8_4_ = auVar38._8_4_ * auVar32._8_4_;
      auVar57._12_4_ = auVar38._12_4_ * auVar32._12_4_;
      local_1378 = vfmsub231ps_fma(auVar57,auVar62,auVar67);
      auVar73._0_4_ = fVar59 * auVar34._0_4_;
      auVar73._4_4_ = fVar59 * auVar34._4_4_;
      auVar73._8_4_ = fVar59 * auVar34._8_4_;
      auVar73._12_4_ = fVar59 * auVar34._12_4_;
      auVar35 = vfmsub231ps_fma(auVar73,auVar43,auVar81);
      auVar75._0_4_ = fVar64 * local_1378._0_4_;
      auVar75._4_4_ = fVar64 * local_1378._4_4_;
      auVar75._8_4_ = fVar64 * local_1378._8_4_;
      auVar75._12_4_ = fVar64 * local_1378._12_4_;
      auVar67 = vfmadd231ps_fma(auVar75,local_1388,auVar80);
      auVar38 = vfmadd231ps_fma(auVar67,local_1398,auVar78);
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar33 = vfmadd231ps_fma(auVar33,auVar35,auVar62);
      auVar67 = vandps_avx(auVar38,auVar67);
      uVar15 = auVar67._0_4_;
      local_1428._0_4_ = (float)(uVar15 ^ auVar33._0_4_);
      uVar69 = auVar67._4_4_;
      local_1428._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
      uVar70 = auVar67._8_4_;
      local_1428._8_4_ = (float)(uVar70 ^ auVar33._8_4_);
      uVar71 = auVar67._12_4_;
      local_1428._12_4_ = (float)(uVar71 ^ auVar33._12_4_);
      auVar67 = vfmadd231ps_fma(auVar56,auVar32,auVar35);
      local_1418._0_4_ = (float)(uVar15 ^ auVar67._0_4_);
      local_1418._4_4_ = (float)(uVar69 ^ auVar67._4_4_);
      local_1418._8_4_ = (float)(uVar70 ^ auVar67._8_4_);
      local_1418._12_4_ = (float)(uVar71 ^ auVar67._12_4_);
      auVar33 = ZEXT816(0) << 0x20;
      auVar67 = vcmpps_avx(local_1428,auVar33,5);
      auVar32 = vcmpps_avx(local_1418,auVar33,5);
      auVar67 = vandps_avx(auVar32,auVar67);
      auVar62._8_4_ = 0x7fffffff;
      auVar62._0_8_ = 0x7fffffff7fffffff;
      auVar62._12_4_ = 0x7fffffff;
      local_13f8 = vandps_avx(auVar38,auVar62);
      auVar32 = vcmpps_avx(auVar38,auVar33,4);
      auVar67 = vandps_avx(auVar32,auVar67);
      auVar32._0_4_ = local_1428._0_4_ + local_1418._0_4_;
      auVar32._4_4_ = local_1428._4_4_ + local_1418._4_4_;
      auVar32._8_4_ = local_1428._8_4_ + local_1418._8_4_;
      auVar32._12_4_ = local_1428._12_4_ + local_1418._12_4_;
      auVar32 = vcmpps_avx(auVar32,local_13f8,2);
      auVar33 = auVar32 & auVar67;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        auVar67 = vandps_avx(auVar67,auVar32);
        auVar51._0_4_ = local_1378._0_4_ * auVar34._0_4_;
        auVar51._4_4_ = local_1378._4_4_ * auVar34._4_4_;
        auVar51._8_4_ = local_1378._8_4_ * auVar34._8_4_;
        auVar51._12_4_ = local_1378._12_4_ * auVar34._12_4_;
        auVar32 = vfmadd213ps_fma(auVar43,local_1388,auVar51);
        auVar32 = vfmadd213ps_fma(auVar39,local_1398,auVar32);
        local_1408._0_4_ = (float)(uVar15 ^ auVar32._0_4_);
        local_1408._4_4_ = (float)(uVar69 ^ auVar32._4_4_);
        local_1408._8_4_ = (float)(uVar70 ^ auVar32._8_4_);
        local_1408._12_4_ = (float)(uVar71 ^ auVar32._12_4_);
        fVar2 = *(float *)(ray + k * 4 + 0x30);
        auVar48._0_4_ = local_13f8._0_4_ * fVar2;
        auVar48._4_4_ = local_13f8._4_4_ * fVar2;
        auVar48._8_4_ = local_13f8._8_4_ * fVar2;
        auVar48._12_4_ = local_13f8._12_4_ * fVar2;
        auVar32 = vcmpps_avx(auVar48,local_1408,1);
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar52._0_4_ = local_13f8._0_4_ * fVar2;
        auVar52._4_4_ = local_13f8._4_4_ * fVar2;
        auVar52._8_4_ = local_13f8._8_4_ * fVar2;
        auVar52._12_4_ = local_13f8._12_4_ * fVar2;
        auVar33 = vcmpps_avx(local_1408,auVar52,2);
        auVar32 = vandps_avx(auVar32,auVar33);
        local_13d8 = vandps_avx(auVar32,auVar67);
        uVar15 = vmovmskps_avx(local_13d8);
        if (uVar15 != 0) {
          auVar67 = vrcpps_avx(local_13f8);
          auVar40._8_4_ = 0x3f800000;
          auVar40._0_8_ = 0x3f8000003f800000;
          auVar40._12_4_ = 0x3f800000;
          auVar32 = vfnmadd213ps_fma(local_13f8,auVar67,auVar40);
          auVar67 = vfmadd132ps_fma(auVar32,auVar67,auVar67);
          fVar59 = auVar67._0_4_;
          fVar64 = auVar67._4_4_;
          fVar65 = auVar67._8_4_;
          fVar66 = auVar67._12_4_;
          local_13a8[0] = fVar59 * local_1408._0_4_;
          local_13a8[1] = fVar64 * local_1408._4_4_;
          local_13a8[2] = fVar65 * local_1408._8_4_;
          local_13a8[3] = fVar66 * local_1408._12_4_;
          local_13c8[0] = fVar59 * local_1428._0_4_;
          local_13c8[1] = fVar64 * local_1428._4_4_;
          local_13c8[2] = fVar65 * local_1428._8_4_;
          local_13c8[3] = fVar66 * local_1428._12_4_;
          local_13b8._0_4_ = fVar59 * local_1418._0_4_;
          local_13b8._4_4_ = fVar64 * local_1418._4_4_;
          local_13b8._8_4_ = fVar65 * local_1418._8_4_;
          local_13b8._12_4_ = fVar66 * local_1418._12_4_;
          uVar22 = (ulong)(uVar15 & 0xff);
          do {
            uVar16 = 0;
            for (uVar19 = uVar22; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              uVar16 = uVar16 + 1;
            }
            uVar15 = *(uint *)((long)&local_1438 + uVar16 * 4);
            pGVar6 = (scene->geometries).items[uVar15].ptr;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar19 = (ulong)(uint)((int)uVar16 * 4);
                local_1338 = *(undefined4 *)((long)local_13c8 + uVar19);
                uVar4 = *(undefined4 *)(local_13b8 + uVar19);
                local_1328._4_4_ = uVar4;
                local_1328._0_4_ = uVar4;
                local_1328._8_4_ = uVar4;
                local_1328._12_4_ = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar19);
                args.context = context->user;
                local_1308._4_4_ = uVar15;
                local_1308._0_4_ = uVar15;
                local_1308._8_4_ = uVar15;
                local_1308._12_4_ = uVar15;
                uVar4 = *(undefined4 *)((long)&local_1448 + uVar19);
                local_1318._4_4_ = uVar4;
                local_1318._0_4_ = uVar4;
                local_1318._8_4_ = uVar4;
                local_1318._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1398 + uVar19);
                uVar5 = *(undefined4 *)(local_1388 + uVar19);
                local_1358._4_4_ = uVar5;
                local_1358._0_4_ = uVar5;
                local_1358._8_4_ = uVar5;
                local_1358._12_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_1378 + uVar19);
                local_1348._4_4_ = uVar5;
                local_1348._0_4_ = uVar5;
                local_1348._8_4_ = uVar5;
                local_1348._12_4_ = uVar5;
                local_1368[0] = (RTCHitN)(char)uVar4;
                local_1368[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar4;
                local_1368[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar4;
                local_1368[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar4;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_1334 = local_1338;
                uStack_1330 = local_1338;
                uStack_132c = local_1338;
                vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                local_1508 = *local_14f0;
                args.valid = (int *)local_1508;
                args.geometryUserPtr = pGVar6->userPtr;
                args.hit = local_1368;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&args);
                }
                if (local_1508 == (undefined1  [16])0x0) {
                  auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar67 = auVar67 ^ _DAT_01f46b70;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&args);
                  }
                  auVar32 = vpcmpeqd_avx(local_1508,_DAT_01f45a50);
                  auVar67 = auVar32 ^ _DAT_01f46b70;
                  auVar44._8_4_ = 0xff800000;
                  auVar44._0_8_ = 0xff800000ff800000;
                  auVar44._12_4_ = 0xff800000;
                  auVar32 = vblendvps_avx(auVar44,*(undefined1 (*) [16])(args.ray + 0x80),auVar32);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar32;
                }
                auVar41._8_8_ = 0x100000001;
                auVar41._0_8_ = 0x100000001;
                if ((auVar41 & auVar67) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar2;
                  goto LAB_01664504;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_01664588;
            }
LAB_01664504:
            uVar22 = uVar22 ^ 1L << (uVar16 & 0x3f);
          } while (uVar22 != 0);
        }
      }
      auVar49 = ZEXT3264(local_11f8);
      auVar53 = ZEXT3264(local_1218);
      auVar54 = ZEXT3264(local_1238);
      auVar58 = ZEXT3264(local_1258);
      auVar63 = ZEXT3264(local_1278);
      auVar68 = ZEXT3264(local_1298);
      auVar74 = ZEXT3264(local_12b8);
      auVar76 = ZEXT3264(local_12d8);
      uVar22 = local_14d8;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }